

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGenerator.cpp
# Opt level: O2

double __thiscall
PyreNet::RandomGenerator::generate_gaussian(RandomGenerator *this,double mean,double std)

{
  result_type_conflict rVar1;
  undefined1 local_50 [8];
  normal_distribution<double> dist;
  unique_lock<std::mutex> lg;
  
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&dist._M_saved_available,(mutex_type *)instanceMutex);
  dist._M_param._M_stddev = 0.0;
  dist._M_saved._0_1_ = 0;
  local_50 = (undefined1  [8])mean;
  dist._M_param._M_mean = std;
  rVar1 = ::std::normal_distribution<double>::operator()
                    ((normal_distribution<double> *)local_50,this->generator);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&dist._M_saved_available);
  return rVar1;
}

Assistant:

double RandomGenerator::generate_gaussian(double mean, double std) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        std::normal_distribution<double> dist(mean, std);
        return dist(*generator);
    }